

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

int __thiscall
reflection::Object::KeyCompareWithValue<std::__cxx11::string>
          (Object *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_name)

{
  bool bVar1;
  uint uVar2;
  String *pSVar3;
  
  pSVar3 = name(this);
  bVar1 = std::operator<((char *)(pSVar3 + 1),_name);
  if (bVar1) {
    uVar2 = 0xffffffff;
  }
  else {
    pSVar3 = name(this);
    bVar1 = std::operator<(_name,(char *)(pSVar3 + 1));
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int KeyCompareWithValue(const StringType& _name) const {
    if (name()->c_str() < _name) return -1;
    if (_name < name()->c_str()) return 1;
    return 0;
  }